

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_function_primitive_isBootstrapPrimitive
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  uint uVar4;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  puVar1 = (ulong *)*arguments;
  sVar3 = 0xf;
  if (((ulong)puVar1 & 0xf) == 0 && puVar1 != (ulong *)0x0) {
    uVar2 = *puVar1;
    if (((uVar2 & 0xf) == 0 && uVar2 != 0) && ((*(byte *)(uVar2 + 8) & 0x80) == 0)) {
      uVar2 = *(ulong *)(uVar2 + 0x70);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar4 = (uint)((long)uVar2 >> 4);
      }
      else {
        uVar4 = (uint)*(undefined8 *)(uVar2 + 0x10);
      }
    }
    else {
      uVar4 = 0;
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      uVar2 = *(ulong *)(*arguments + 0x28);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar4 = (uint)((long)uVar2 >> 4);
      }
      else {
        uVar4 = (uint)*(undefined8 *)(uVar2 + 0x10);
      }
      sVar3 = (ulong)(byte)(*(long *)(*arguments + 0x48) == 0 | (byte)((uVar4 & 4) >> 2)) << 4 | 0xf
      ;
    }
  }
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_isBootstrapPrimitive(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    if(!sysbvm_tuple_isFunction(context, *function))
        return SYSBVM_FALSE_TUPLE;
    
    sysbvm_function_t **functionObject = (sysbvm_function_t **)function;
    size_t flags = sysbvm_tuple_bitflags_decode((*functionObject)->flags);
    bool isCorePrimitive = (flags & SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE) != 0;
    bool isUndefined = !(*functionObject)->definition;
    
    return sysbvm_tuple_boolean_encode(isCorePrimitive || isUndefined);
}